

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_reopen_with_iterator(void)

{
  fdb_encryption_key *__s;
  short *psVar1;
  size_t *psVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle *pfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint64_t extraout_RAX;
  uint64_t uVar10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar11;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_config *kvs_config_00;
  fdb_kvs_commit_marker_t *pfVar13;
  fdb_file_info *kvs_config_01;
  void *__s2;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  code *__s_00;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar17;
  char cVar18;
  uint uVar19;
  char *unaff_RBP;
  fdb_kvs_handle *pfVar20;
  char *pcVar21;
  fdb_file_info *info;
  fdb_file_handle *pfVar22;
  fdb_iterator *pfVar23;
  void *pvVar24;
  fdb_kvs_handle *pfVar25;
  undefined1 handle [8];
  void *unaff_R12;
  fdb_kvs_handle *pfVar26;
  size_t unaff_R13;
  __atomic_base<unsigned_long> _Var27;
  filemgr *ptr_fhandle;
  fdb_config *pfVar28;
  ulong uVar29;
  size_t sVar30;
  char *pcVar31;
  char *pcVar32;
  btree *pbVar33;
  fdb_doc **ppfVar34;
  timeval tVar35;
  timeval tVar36;
  fdb_kvs_handle *db;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_file_handle *compact_file;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_17580;
  undefined1 auStack_17578 [16];
  undefined1 auStack_17568 [8];
  undefined1 auStack_17560 [80];
  ulong uStack_17510;
  timeval tStack_174f0;
  fdb_file_info afStack_174e0 [3];
  fdb_file_info afStack_173e0 [3];
  fdb_config fStack_172e0;
  filemgr *pfStack_171e8;
  fdb_kvs_handle *pfStack_171e0;
  fdb_kvs_handle *pfStack_171d8;
  fdb_config *pfStack_171d0;
  fdb_kvs_handle *pfStack_171c8;
  fdb_kvs_handle *pfStack_171c0;
  fdb_file_handle *pfStack_171b0;
  fdb_kvs_handle *pfStack_171a8;
  timeval atStack_171a0 [2];
  timeval tStack_17180;
  timeval tStack_17170;
  undefined1 auStack_17160 [70];
  undefined1 uStack_1711a;
  undefined8 uStack_17110;
  filemgr *pfStack_17050;
  fdb_kvs_handle *pfStack_17048;
  fdb_kvs_handle *pfStack_17040;
  filemgr *pfStack_17038;
  fdb_kvs_handle *pfStack_17030;
  fdb_kvs_handle *pfStack_17028;
  undefined1 auStack_17018 [8];
  undefined1 auStack_17010 [8];
  undefined1 auStack_17008 [8];
  undefined1 auStack_17000 [16];
  undefined1 auStack_16ff0 [16];
  fdb_kvs_config fStack_16fe0;
  atomic<unsigned_long> aStack_16fc8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16fc0;
  __atomic_base<unsigned_long> _Stack_16fb8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16fb0;
  undefined1 auStack_16fa8 [8];
  undefined1 auStack_16fa0 [16];
  undefined1 auStack_16f90 [16];
  atomic<unsigned_long> aStack_16f80;
  fdb_open_flags fStack_16f6c;
  ushort uStack_16f62;
  filemgr *pfStack_16f58;
  atomic<unsigned_long> aStack_16f18;
  undefined1 auStack_16e98 [16];
  timeval tStack_16e88;
  undefined1 auStack_16e78 [328];
  char acStack_16d30 [256];
  char acStack_16c30 [256];
  fdb_kvs_handle afStack_16b30 [153];
  fdb_kvs_handle *pfStack_3268;
  fdb_kvs_handle *pfStack_3260;
  list *plStack_3258;
  void *pvStack_3250;
  fdb_kvs_config fStack_3248;
  fdb_kvs_info fStack_3230;
  timeval tStack_3200;
  fdb_config fStack_31f0;
  char acStack_30f8 [256];
  fdb_kvs_handle afStack_2ff8 [2];
  fdb_kvs_handle **ppfStack_2ad0;
  fdb_kvs_handle *pfStack_2ac8;
  fdb_kvs_handle *pfStack_2ac0;
  fdb_kvs_config *pfStack_2ab8;
  fdb_kvs_handle *pfStack_2ab0;
  fdb_kvs_handle *pfStack_2aa8;
  undefined1 auStack_2a90 [16];
  undefined1 auStack_2a80 [32];
  fdb_kvs_handle *pfStack_2a60;
  fdb_kvs_config fStack_2a58;
  fdb_kvs_info fStack_2a40;
  timeval tStack_2a10;
  char acStack_2a00 [256];
  undefined1 auStack_2900 [752];
  char acStack_2610 [256];
  fdb_kvs_handle fStack_2510;
  fdb_doc **ppfStack_2308;
  fdb_kvs_handle *pfStack_2300;
  undefined1 auStack_22e8 [16];
  fdb_doc *pfStack_22d8;
  fdb_kvs_handle *pfStack_22d0;
  fdb_doc *apfStack_22c8 [11];
  timeval tStack_2270;
  undefined1 auStack_2260 [536];
  char acStack_2048 [256];
  stat sStack_1f48;
  fdb_config fStack_1eb8;
  fdb_kvs_handle **ppfStack_1dc0;
  fdb_kvs_handle *pfStack_1db8;
  fdb_kvs_handle *pfStack_1db0;
  fdb_kvs_handle *pfStack_1da8;
  btree *pbStack_1da0;
  fdb_kvs_handle *pfStack_1d98;
  fdb_kvs_handle *pfStack_1d88;
  fdb_kvs_handle *pfStack_1d80;
  fdb_file_handle *pfStack_1d78;
  fdb_kvs_handle *pfStack_1d70;
  undefined1 auStack_1d68 [32];
  undefined1 auStack_1d48 [40];
  fdb_file_info fStack_1d20;
  fdb_config fStack_1cd8;
  btree abStack_1be0 [4];
  char acStack_1ae0 [256];
  char acStack_19e0 [264];
  code *pcStack_18d8;
  fdb_kvs_handle *pfStack_18d0;
  fdb_kvs_handle *pfStack_18c8;
  char *pcStack_18c0;
  char *pcStack_18b8;
  fdb_kvs_handle *pfStack_18b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1898;
  fdb_file_handle *pfStack_1890;
  fdb_kvs_handle *pfStack_1888;
  int iStack_187c;
  undefined1 auStack_1878 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1838;
  fdb_kvs_config fStack_1810;
  timeval tStack_17f8;
  char acStack_17e8 [256];
  fdb_doc *apfStack_16e8 [20];
  undefined1 auStack_1648 [520];
  undefined8 uStack_1440;
  undefined8 uStack_1438;
  undefined4 uStack_1424;
  undefined1 uStack_1419;
  undefined1 uStack_1408;
  undefined8 uStack_1390;
  size_t sStack_1350;
  size_t sStack_1348;
  fdb_doc **ppfStack_1340;
  char *pcStack_1338;
  code *pcStack_1330;
  code *pcStack_1328;
  fdb_file_handle *pfStack_1310;
  fdb_snapshot_info_t *pfStack_1308;
  uint64_t uStack_1300;
  uint uStack_12f4;
  fdb_kvs_handle *apfStack_12f0 [4];
  fdb_kvs_config fStack_12d0;
  char acStack_12b8 [8];
  timeval tStack_12b0;
  char acStack_12a0 [256];
  char acStack_11a0 [256];
  char acStack_10a0 [264];
  fdb_config fStack_f98;
  fdb_doc *apfStack_ea0 [301];
  fdb_kvs_handle **ppfStack_538;
  void *pvStack_530;
  size_t sStack_528;
  fdb_kvs_handle *pfStack_520;
  btree *pbStack_518;
  code *pcStack_510;
  fdb_kvs_handle *local_4f8;
  fdb_iterator *local_4f0;
  fdb_kvs_handle *local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [40];
  btree bStack_4a8;
  fdb_kvs_info local_460;
  fdb_config local_430;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  pcStack_510 = (code *)0x10d8fa;
  gettimeofday((timeval *)(local_4d0 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_510 = (code *)0x10d8ff;
  memleak_start();
  local_4e8 = (fdb_kvs_handle *)0x0;
  pcStack_510 = (code *)0x10d914;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_510 = (code *)0x10d924;
  fdb_get_default_config();
  pfVar5 = (fdb_kvs_handle *)local_4d0;
  pcStack_510 = (code *)0x10d931;
  fdb_get_default_kvs_config();
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  pbVar33 = (btree *)local_4e0;
  pcStack_510 = (code *)0x10d95b;
  fdb_open((fdb_file_handle **)pbVar33,"./compact_test1",&local_430);
  ppfVar17 = &local_4f8;
  pcStack_510 = (code *)0x10d975;
  fdb_kvs_open((fdb_file_handle *)local_4e0._0_8_,ppfVar17,"db",(fdb_kvs_config *)pfVar5);
  pcStack_510 = (code *)0x10d98b;
  pfVar26 = local_4f8;
  fVar3 = fdb_set_log_callback(local_4f8,logCallbackFunc,"compact_reopen_with_iterator");
  uVar19 = (uint)pfVar26;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (void *)0x0;
    uVar14 = 0;
    do {
      pcStack_510 = (code *)0x10d9b3;
      sprintf(local_138,"key%d",uVar14 & 0xffffffff);
      pcStack_510 = (code *)0x10d9cb;
      sprintf(local_238,"meta%d",uVar14 & 0xffffffff);
      pcStack_510 = (code *)0x10d9e3;
      sprintf(local_338,"body%d",uVar14 & 0xffffffff);
      pbVar33 = (btree *)(&bStack_4a8.ksize + (long)unaff_R12);
      pcStack_510 = (code *)0x10d9f3;
      unaff_R13 = strlen(local_138);
      unaff_RBP = local_238;
      pcStack_510 = (code *)0x10da06;
      pfVar5 = (fdb_kvs_handle *)strlen(unaff_RBP);
      pcStack_510 = (code *)0x10da16;
      sVar6 = strlen(local_338);
      pcStack_510 = (code *)0x10da3b;
      fdb_doc_create((fdb_doc **)pbVar33,local_138,unaff_R13,unaff_RBP,(size_t)pfVar5,local_338,
                     sVar6);
      pcStack_510 = (code *)0x10da4a;
      fdb_set(local_4f8,*(fdb_doc **)(&bStack_4a8.ksize + uVar14 * 8));
      uVar14 = uVar14 + 1;
      unaff_R12 = (void *)((long)unaff_R12 + 8);
    } while (uVar14 != 9);
    pcStack_510 = (code *)0x10da67;
    fdb_commit((fdb_file_handle *)local_4e0._0_8_,'\0');
    ppfVar17 = (fdb_kvs_handle **)(local_4e0 + 8);
    pcStack_510 = (code *)0x10da83;
    fdb_open((fdb_file_handle **)ppfVar17,"./compact_test1",&local_430);
    pcStack_510 = (code *)0x10da92;
    pfVar22 = (fdb_file_handle *)local_4e0._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)local_4e0._8_8_,"./compact_test2");
    uVar19 = (uint)pfVar22;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dcb5;
    pcStack_510 = (code *)0x10daa4;
    fdb_close((fdb_file_handle *)local_4e0._8_8_);
    pcStack_510 = (code *)0x10dac4;
    pfVar26 = local_4f8;
    fVar3 = fdb_iterator_init(local_4f8,&local_4f0,(void *)0x0,0,(void *)0x0,0,0);
    uVar19 = (uint)pfVar26;
    pfVar26 = pfVar5;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dcba;
    unaff_R13 = 0;
    ppfVar17 = &local_4e8;
    do {
      pcStack_510 = (code *)0x10dae1;
      fVar3 = fdb_iterator_get(local_4f0,(fdb_doc **)ppfVar17);
      pfVar26 = local_4e8;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0010dc95:
        pcStack_510 = (code *)0x10dc9a;
        compact_reopen_with_iterator();
LAB_0010dc9a:
        pcStack_510 = (code *)0x10dca5;
        compact_reopen_with_iterator();
LAB_0010dca5:
        pcStack_510 = (code *)0x10dcb0;
        pvVar24 = unaff_R12;
        compact_reopen_with_iterator();
        uVar19 = (uint)pvVar24;
        goto LAB_0010dcb0;
      }
      pbVar33 = (btree *)local_4e8->op_stats;
      unaff_RBP = *(char **)(&bStack_4a8.ksize + unaff_R13 * 8);
      unaff_R12 = *(void **)(unaff_RBP + 0x20);
      pcStack_510 = (code *)0x10db09;
      iVar4 = bcmp(pbVar33,unaff_R12,*(size_t *)&local_4e8->kvs_config);
      pfVar5 = pfVar26;
      if (iVar4 != 0) {
        pcStack_510 = (code *)0x10dc95;
        compact_reopen_with_iterator();
        goto LAB_0010dc95;
      }
      pbVar33 = pfVar26->staletree;
      unaff_R12 = *(void **)(unaff_RBP + 0x38);
      pcStack_510 = (code *)0x10db28;
      iVar4 = bcmp(pbVar33,unaff_R12,(size_t)(pfVar26->kvs_config).custom_cmp);
      if (iVar4 != 0) goto LAB_0010dca5;
      pbVar33 = (pfVar26->field_6).seqtree;
      unaff_R12 = *(void **)(unaff_RBP + 0x40);
      pcStack_510 = (code *)0x10db47;
      iVar4 = bcmp(pbVar33,unaff_R12,(size_t)(pfVar26->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_0010dc9a;
      pcStack_510 = (code *)0x10db57;
      fdb_doc_free((fdb_doc *)pfVar26);
      local_4e8 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      pcStack_510 = (code *)0x10db6d;
      pfVar23 = local_4f0;
      fVar3 = fdb_iterator_next(local_4f0);
      uVar19 = (uint)pfVar23;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 9) goto LAB_0010dcbf;
    pcStack_510 = (code *)0x10db8a;
    fVar3 = fdb_iterator_close(local_4f0);
    uVar19 = (uint)local_4f0;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pcStack_510 = (code *)0x10dbaa;
      fdb_get_kvs_info(local_4f8,&local_460);
      lVar15 = (long)(int)local_460.doc_count;
      pcStack_510 = (code *)0x10dbb6;
      fdb_kvs_close(local_4f8);
      pcStack_510 = (code *)0x10dbc4;
      fdb_close((fdb_file_handle *)local_4e0._0_8_);
      pcStack_510 = (code *)0x10dbdb;
      fdb_open((fdb_file_handle **)local_4e0,"./compact_test2",&local_430);
      pcStack_510 = (code *)0x10dbf3;
      fdb_kvs_open((fdb_file_handle *)local_4e0._0_8_,&local_4f8,"db",(fdb_kvs_config *)local_4d0);
      pcStack_510 = (code *)0x10dbfe;
      fdb_get_kvs_info(local_4f8,&local_460);
      if (lVar15 != CONCAT44(local_460.doc_count._4_4_,(int)local_460.doc_count)) {
        pcStack_510 = (code *)0x10dc14;
        compact_reopen_with_iterator();
      }
      pcStack_510 = (code *)0x10dc1e;
      fdb_kvs_close(local_4f8);
      pcStack_510 = (code *)0x10dc28;
      fdb_close((fdb_file_handle *)local_4e0._0_8_);
      lVar15 = 0;
      do {
        pcStack_510 = (code *)0x10dc34;
        fdb_doc_free(*(fdb_doc **)(&bStack_4a8.ksize + lVar15 * 8));
        lVar15 = lVar15 + 1;
      } while (lVar15 != 9);
      pcStack_510 = (code *)0x10dc42;
      fdb_shutdown();
      pcStack_510 = (code *)0x10dc47;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_510 = (code *)0x10dc78;
      fprintf(_stderr,pcVar21,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dcb0:
    pcStack_510 = (code *)0x10dcb5;
    compact_reopen_with_iterator();
LAB_0010dcb5:
    pcStack_510 = (code *)0x10dcba;
    compact_reopen_with_iterator();
    pfVar26 = pfVar5;
LAB_0010dcba:
    pcStack_510 = (code *)0x10dcbf;
    compact_reopen_with_iterator();
LAB_0010dcbf:
    pcStack_510 = (code *)0x10dcc4;
    compact_reopen_with_iterator();
  }
  pcStack_510 = estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_1328 = (code *)0x10dceb;
  ppfStack_538 = ppfVar17;
  pvStack_530 = unaff_R12;
  sStack_528 = unaff_R13;
  pfStack_520 = pfVar26;
  pbStack_518 = pbVar33;
  pcStack_510 = (code *)unaff_RBP;
  gettimeofday(&tStack_12b0,(__timezone_ptr_t)0x0);
  pcStack_1328 = (code *)0x10dcf0;
  memleak_start();
  pcStack_1328 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_1328 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  fStack_f98.buffercache_size = 0;
  fStack_f98.wal_threshold = 0x32;
  fStack_f98.flags = 1;
  fStack_f98.compaction_threshold = '\0';
  fStack_f98.block_reusing_threshold = 0;
  pcStack_1328 = (code *)0x10dd38;
  fStack_f98.multi_kv_instances = (bool)(char)uVar19;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_1328 = (code *)0x10dd4c;
  fdb_open(&pfStack_1310,"./compact_test1",&fStack_f98);
  uStack_12f4 = uVar19;
  if (uVar19 == 0) {
    pcStack_1328 = (code *)0x10ddb8;
    fdb_kvs_open_default(pfStack_1310,apfStack_12f0,&fStack_12d0);
    sVar16 = 1;
  }
  else {
    ppfVar17 = apfStack_12f0;
    uVar14 = 0;
    do {
      pcStack_1328 = (code *)0x10dd7d;
      sprintf(acStack_12b8,"kv%d",uVar14 & 0xffffffff);
      pcStack_1328 = (code *)0x10dd90;
      fdb_kvs_open(pfStack_1310,ppfVar17,acStack_12b8,&fStack_12d0);
      uVar14 = uVar14 + 1;
      ppfVar17 = ppfVar17 + 1;
    } while (uVar14 != 4);
    sVar16 = 4;
  }
  uVar14 = 0;
  do {
    pcStack_1328 = (code *)0x10dddc;
    sprintf(acStack_10a0,"key%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10ddf5;
    sprintf(acStack_11a0,"meta%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10de0e;
    sprintf(acStack_12a0,"body%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10de21;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10de34;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10de44;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10de69;
    fdb_doc_create(apfStack_ea0 + uVar14,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar30 = 0;
    do {
      pcStack_1328 = (code *)0x10de7a;
      fdb_set(apfStack_12f0[sVar30],apfStack_ea0[uVar14]);
      sVar30 = sVar30 + 1;
    } while (sVar16 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x4b);
  pcStack_1328 = (code *)0x10de9e;
  fdb_commit(pfStack_1310,'\x01');
  uVar14 = 0x4b;
  do {
    pcStack_1328 = (code *)0x10dec0;
    sprintf(acStack_10a0,"key%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10ded9;
    sprintf(acStack_11a0,"meta%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10def2;
    sprintf(acStack_12a0,"body%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10df05;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10df18;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10df28;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10df4d;
    fdb_doc_create(apfStack_ea0 + uVar14,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar30 = 0;
    do {
      pcStack_1328 = (code *)0x10df5e;
      fdb_set(apfStack_12f0[sVar30],apfStack_ea0[uVar14]);
      sVar30 = sVar30 + 1;
    } while (sVar16 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x96);
  lVar15 = 0;
  do {
    sVar30 = 0;
    do {
      pcStack_1328 = (code *)0x10df8e;
      fdb_set(apfStack_12f0[sVar30],apfStack_ea0[lVar15]);
      sVar30 = sVar30 + 1;
    } while (sVar16 != sVar30);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x4b);
  lVar15 = 0;
  do {
    sVar30 = 0;
    do {
      pcStack_1328 = (code *)0x10dfb7;
      fdb_set(apfStack_12f0[sVar30],apfStack_ea0[lVar15]);
      sVar30 = sVar30 + 1;
    } while (sVar16 != sVar30);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x4b);
  pcStack_1328 = (code *)0x10dfd4;
  fdb_commit(pfStack_1310,'\0');
  uVar14 = 0x96;
  do {
    pcStack_1328 = (code *)0x10dff6;
    sprintf(acStack_10a0,"key%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10e00f;
    sprintf(acStack_11a0,"meta%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10e028;
    sprintf(acStack_12a0,"body%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10e03b;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10e04e;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10e05e;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10e083;
    fdb_doc_create(apfStack_ea0 + uVar14,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar30 = 0;
    do {
      pcStack_1328 = (code *)0x10e094;
      fdb_set(apfStack_12f0[sVar30],apfStack_ea0[uVar14]);
      sVar30 = sVar30 + 1;
    } while (sVar16 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0xe1);
  pcStack_1328 = (code *)0x10e0bb;
  fdb_commit(pfStack_1310,'\x01');
  uVar14 = 0xe1;
  do {
    pcStack_1328 = (code *)0x10e0dd;
    sprintf(acStack_10a0,"key%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10e0f6;
    sprintf(acStack_11a0,"meta%d",uVar14 & 0xffffffff);
    pcStack_1328 = (code *)0x10e10f;
    sprintf(acStack_12a0,"body%d",uVar14 & 0xffffffff);
    ppfVar34 = apfStack_ea0 + uVar14;
    pcStack_1328 = (code *)0x10e122;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10e135;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10e145;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10e16a;
    fdb_doc_create(ppfVar34,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar30 = 0;
    do {
      pcStack_1328 = (code *)0x10e17b;
      fdb_set(apfStack_12f0[sVar30],*ppfVar34);
      sVar30 = sVar30 + 1;
    } while (sVar16 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 300);
  sVar30 = 0;
  pcStack_1328 = (code *)0x10e1a2;
  fdb_commit(pfStack_1310,'\0');
  do {
    pfVar5 = apfStack_12f0[sVar30];
    pcStack_1328 = (code *)0x10e1c0;
    fVar3 = fdb_set_log_callback(pfVar5,logCallbackFunc,"estimate_space_upto_test");
    iVar4 = (int)pfVar5;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_1328 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar30 = sVar30 + 1;
  } while (sVar16 != sVar30);
  pcStack_1328 = (code *)0x10e1e4;
  pfVar22 = pfStack_1310;
  fVar3 = fdb_get_all_snap_markers(pfStack_1310,&pfStack_1308,&uStack_1300);
  iVar4 = (int)pfVar22;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    sVar6 = (size_t)uStack_12f4;
    cVar18 = (char)uStack_12f4;
    uVar10 = uStack_1300;
    if (cVar18 != '\0') {
      if (uStack_1300 != 8) {
        pcStack_1328 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_1328 = (code *)0x10e21d;
      sVar16 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[1].marker);
      pcStack_1328 = (code *)0x10e233;
      sVar9 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[2].marker);
      if (sVar9 <= sVar16) {
        pcStack_1328 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar10 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_1328 = (code *)0x10e28e;
      fVar3 = fdb_free_snap_markers(pfStack_1308,uStack_1300);
      iVar4 = (int)pfStack_1308;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pcStack_1328 = (code *)0x10e2a0;
        fdb_close(pfStack_1310);
        lVar15 = 0;
        do {
          pcStack_1328 = (code *)0x10e2af;
          fdb_doc_free(apfStack_ea0[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 300);
        pcStack_1328 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_1328 = (code *)0x10e2c5;
        memleak_end();
        pcVar21 = "single kv mode:";
        if (cVar18 != '\0') {
          pcVar21 = "multiple kv mode:";
        }
        pcStack_1328 = (code *)0x10e2f3;
        sprintf(acStack_12a0,"estimate space upto marker in file test %s",pcVar21);
        pcVar21 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStack_1328 = (code *)0x10e320;
        fprintf(_stderr,pcVar21,acStack_12a0);
        return;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar10 != 4) {
      pcStack_1328 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_1328 = (code *)0x10e260;
    sVar16 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[1].marker);
    pcStack_1328 = (code *)0x10e276;
    pfVar22 = pfStack_1310;
    sVar9 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[2].marker);
    iVar4 = (int)pfVar22;
    if (sVar16 < sVar9) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_1328 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_1328 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_1328 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_1330 = logCallbackFunc;
  pcStack_1338 = "estimate_space_upto_test";
  pfStack_18b0 = (fdb_kvs_handle *)0x10e36b;
  sStack_1350 = sVar16;
  sStack_1348 = sVar30;
  ppfStack_1340 = ppfVar34;
  pcStack_1328 = (code *)sVar6;
  gettimeofday(&tStack_17f8,(__timezone_ptr_t)0x0);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_18b0 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_18b0 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_1440 = 0;
  uStack_1438 = 0x400;
  uStack_1424 = 1;
  uStack_1419 = 0;
  uStack_1390 = 0;
  pfStack_18b0 = (fdb_kvs_handle *)0x10e3bb;
  uStack_1408 = (char)iVar4;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18b0 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_1890,"./compact_test1",(fdb_config *)(auStack_1648 + 0x200));
  iStack_187c = iVar4;
  if (iVar4 == 0) {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_1890,(fdb_kvs_handle **)(auStack_1878 + 0x20),&fStack_1810);
    uVar19 = 1;
  }
  else {
    ppfVar17 = (fdb_kvs_handle **)(auStack_1878 + 0x20);
    uVar14 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_1878,"kv%d",uVar14 & 0xffffffff);
      pfStack_18b0 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_1890,ppfVar17,auStack_1878,&fStack_1810);
      uVar14 = uVar14 + 1;
      ppfVar17 = ppfVar17 + 1;
    } while (uVar14 != 4);
    uVar19 = 4;
  }
  pcVar21 = (char *)(ulong)uVar19;
  uVar14 = 0;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_1648 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_1648,"meta%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_17e8,"body%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e4a9;
    sVar6 = strlen(auStack_1648 + 0x100);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e4bc;
    sVar7 = strlen(auStack_1648);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e4cc;
    sVar8 = strlen(acStack_17e8);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_16e8 + uVar14,auStack_1648 + 0x100,sVar6,auStack_1648,sVar7,acStack_17e8
                   ,sVar8);
    lVar15 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar15 * 8 + 0x20),apfStack_16e8[uVar14]);
      lVar15 = lVar15 + 1;
    } while (pcVar21 != (char *)lVar15);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 5);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_1890,'\x01');
  uVar14 = 5;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_1648 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_1648,"meta%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_17e8,"body%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e588;
    sVar6 = strlen(auStack_1648 + 0x100);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e59b;
    sVar7 = strlen(auStack_1648);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e5ab;
    sVar8 = strlen(acStack_17e8);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_16e8 + uVar14,auStack_1648 + 0x100,sVar6,auStack_1648,sVar7,acStack_17e8
                   ,sVar8);
    lVar15 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar15 * 8 + 0x20),apfStack_16e8[uVar14]);
      lVar15 = lVar15 + 1;
    } while (pcVar21 != (char *)lVar15);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 10);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_1890,'\0');
  uVar14 = 10;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_1648 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_1648,"meta%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_17e8,"body%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e665;
    sVar6 = strlen(auStack_1648 + 0x100);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e678;
    sVar7 = strlen(auStack_1648);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e688;
    sVar8 = strlen(acStack_17e8);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_16e8 + uVar14,auStack_1648 + 0x100,sVar6,auStack_1648,sVar7,acStack_17e8
                   ,sVar8);
    lVar15 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar15 * 8 + 0x20),apfStack_16e8[uVar14]);
      lVar15 = lVar15 + 1;
    } while (pcVar21 != (char *)lVar15);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0xf);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_1890,'\x01');
  uVar14 = 0xf;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_1648 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_1648,"meta%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_17e8,"body%d",uVar14 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e745;
    pfVar5 = (fdb_kvs_handle *)strlen(auStack_1648 + 0x100);
    doc._M_i = (__int_type_conflict)auStack_1648;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e758;
    sVar6 = strlen((char *)doc._M_i);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e768;
    sVar7 = strlen(acStack_17e8);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_16e8 + uVar14,auStack_1648 + 0x100,(size_t)pfVar5,(void *)doc._M_i,sVar6
                   ,acStack_17e8,sVar7);
    lVar15 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar15 * 8 + 0x20),apfStack_16e8[uVar14]);
      lVar15 = lVar15 + 1;
    } while (pcVar21 != (char *)lVar15);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x14);
  pfVar26 = (fdb_kvs_handle *)0x0;
  pfStack_18b0 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_1890,'\0');
  __s_00 = logCallbackFunc;
  pcVar31 = "compact_upto_test";
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e7e0;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1878 + (long)pfVar26 * 8 + 0x20),logCallbackFunc
                       ,"compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar21 != pfVar26);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e804;
  fVar3 = fdb_get_all_snap_markers
                    (pfStack_1890,(fdb_snapshot_info_t **)&aStack_1898.seqtree,
                     (uint64_t *)&pfStack_1888);
  pcVar32 = pcVar31;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2f;
  if ((char)iStack_187c == '\0') {
    if (pfStack_1888 != (fdb_kvs_handle *)0x4) {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e92b;
      compact_upto_test();
    }
    pfVar26 = (fdb_kvs_handle *)0x1400000000;
    doc._M_i = 0;
    pfVar5 = (fdb_kvs_handle *)0xfffffffb00000000;
    pcVar21 = auStack_1878 + 0x40;
    pcVar32 = (char *)0x0;
    aVar11 = aStack_1898;
    do {
      if (*(long *)((long)&(aVar11.seqtree)->root_bid + doc._M_i) != 1) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10e98d;
        compact_upto_test();
        aVar11 = aStack_1838;
      }
      if (*(long *)(*(long *)((long)&(aVar11.seqtree)->blk_handle + doc._M_i) + 8) !=
          (long)pfVar26 >> 0x20) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10e9a2;
        compact_upto_test();
        aVar11 = aStack_1838;
      }
      pcVar32 = (char *)((long)pcVar32 + 1);
      pfVar26 = (fdb_kvs_handle *)(pfVar26[-0x2762763].config.encryption_key.bytes + 0x14);
      doc._M_i = doc._M_i + 0x18;
    } while (pcVar32 < pfStack_1888);
    __s_00 = (code *)(auStack_1878 + 0x40);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e9c4;
    sprintf((char *)__s_00,"compact_test_compact%d",1);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e9da;
    fVar3 = fdb_compact_upto(pfStack_1890,(char *)__s_00,
                             (fdb_snapshot_marker_t)(aStack_1898.seqtree)->blk_ops);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e9fe;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1878._32_8_,
                                (fdb_kvs_handle **)(auStack_1878 + 0x18),
                                (fdb_seqnum_t)(aStack_1898.seqtrie)->btree_blk_ops->blk_alloc_sub);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10ea07;
        compact_upto_test();
        goto LAB_0010ea07;
      }
LAB_0010ea64:
      __s_00 = (code *)(auStack_1878 + 0x40);
      pfStack_18b0 = (fdb_kvs_handle *)0x10ea6e;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1878._24_8_);
      pfStack_18b0 = (fdb_kvs_handle *)0x10ea7d;
      fVar3 = fdb_free_snap_markers
                        ((fdb_snapshot_info_t *)aStack_1898.seqtree,(uint64_t)pfStack_1888);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10ea8f;
        fdb_close(pfStack_1890);
        lVar15 = 0;
        do {
          pfStack_18b0 = (fdb_kvs_handle *)0x10ea9e;
          fdb_doc_free(apfStack_16e8[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x14);
        pfStack_18b0 = (fdb_kvs_handle *)0x10eaac;
        fdb_shutdown();
        pfStack_18b0 = (fdb_kvs_handle *)0x10eab1;
        memleak_end();
        pcVar21 = "single kv mode:";
        if ((char)iStack_187c != '\0') {
          pcVar21 = "multiple kv mode:";
        }
        pfStack_18b0 = (fdb_kvs_handle *)0x10eae1;
        sprintf(acStack_17e8,"compact upto marker in file test %s",pcVar21);
        pcVar21 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_18b0 = (fdb_kvs_handle *)0x10eb0e;
        fprintf(_stderr,pcVar21,acStack_17e8);
        return;
      }
      goto LAB_0010eb34;
    }
    goto LAB_0010eb39;
  }
  if (pfStack_1888 != (fdb_kvs_handle *)0x8) {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e82c;
    compact_upto_test();
  }
  auStack_1878._8_8_ = ZEXT48(uVar19 + 1);
  doc._M_i = (__int_type_conflict)auStack_1878;
  pcVar32 = (char *)0x0;
  do {
    __s_00 = (code *)((long)pcVar32 * 3);
    aVar11 = aStack_1898;
    if ((fdb_custom_cmp_variable)(&(aStack_1898.seqtree)->root_bid)[(long)pcVar32 * 3] !=
        (fdb_custom_cmp_variable)auStack_1878._8_8_) {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e911;
      compact_upto_test();
      aVar11 = aStack_1838;
    }
    pfVar5 = (fdb_kvs_handle *)((long)pcVar32 * -5 + 0x14);
    pfVar13 = (fdb_kvs_commit_marker_t *)(&(aVar11.seqtree)->blk_handle)[(long)pcVar32 * 3];
    pfVar26 = (fdb_kvs_handle *)0x8;
    pcVar31 = (char *)0x0;
    auStack_1878._16_8_ = pcVar32;
    do {
      if (*(fdb_kvs_handle **)(&(pfVar26->kvs_config).create_if_missing + (long)pfVar13) != pfVar5)
      {
        pfStack_18b0 = (fdb_kvs_handle *)0x10e8e2;
        compact_upto_test();
      }
      pfStack_18b0 = (fdb_kvs_handle *)0x10e892;
      sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar31 & 0xffffffff);
      pfVar13 = (fdb_kvs_commit_marker_t *)(&(aStack_1898.seqtree)->blk_handle)[(long)pcVar32 * 3];
      psVar1 = *(short **)((long)&pfVar13[-1].seqnum + (long)pfVar26);
      if ((char)psVar1[1] != auStack_1878[2] || *psVar1 != auStack_1878._0_2_) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10eb2a;
        compact_upto_test();
        goto LAB_0010eb2a;
      }
      pcVar31 = pcVar31 + 1;
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).custom_cmp_param;
    } while (pcVar21 != pcVar31);
    pcVar32 = (char *)(auStack_1878._16_8_ + 1);
  } while (pcVar32 != pcVar21);
LAB_0010ea07:
  __s_00 = (code *)(auStack_1878 + 0x40);
  pfStack_18b0 = (fdb_kvs_handle *)0x10ea22;
  sprintf((char *)__s_00,"compact_test_compact%d",1);
  pfStack_18b0 = (fdb_kvs_handle *)0x10ea38;
  fVar3 = fdb_compact_upto(pfStack_1890,(char *)__s_00,
                           (fdb_snapshot_marker_t)(aStack_1898.seqtree)->blk_ops);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
  pfStack_18b0 = (fdb_kvs_handle *)0x10ea5c;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1878._40_8_,
                            (fdb_kvs_handle **)(auStack_1878 + 0x18),
                            (fdb_seqnum_t)(aStack_1898.seqtrie)->btree_blk_ops->blk_read);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
  goto LAB_0010eb43;
LAB_001108a3:
  pfStack_17028 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var27._M_i;
LAB_001108ae:
  _Var27._M_i = doc._M_i;
  pfStack_17028 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_17028 = (fdb_kvs_handle *)0x1108be;
  pcVar31 = pcVar21;
  compaction_daemon_test();
  doc._M_i = _Var27._M_i;
LAB_001108be:
  pfVar12 = (fdb_kvs_handle *)auStack_17000;
  ptr_fhandle = (filemgr *)(auStack_16e78 + 0x48);
  pfStack_17028 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_0010eb2a:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar32 = pcVar31;
LAB_0010eb2f:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eb34;
  compact_upto_test();
LAB_0010eb34:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eb39;
  compact_upto_test();
LAB_0010eb39:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eb3e;
  compact_upto_test();
LAB_0010eb3e:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eb43;
  compact_upto_test();
LAB_0010eb43:
  pfStack_18b0 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_1d98 = (fdb_kvs_handle *)0x10eb65;
  pcStack_18d8 = __s_00;
  pfStack_18d0 = pfVar26;
  pfStack_18c8 = (fdb_kvs_handle *)doc._M_i;
  pcStack_18c0 = pcVar21;
  pcStack_18b8 = pcVar32;
  pfStack_18b0 = pfVar5;
  gettimeofday((timeval *)(auStack_1d48 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1d98 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_1d98 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1d98 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_1d48;
  pfStack_1d98 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_1cd8.buffercache_size = 0x1000000;
  fStack_1cd8.wal_threshold = 0x400;
  fStack_1cd8.flags = 1;
  fStack_1cd8.compaction_threshold = '\0';
  pbVar33 = (btree *)&pfStack_1d78;
  pfStack_1d98 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)pbVar33,"./compact_test1",&fStack_1cd8);
  ppfVar17 = &pfStack_1d88;
  pfStack_1d98 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_1d78,ppfVar17,(fdb_kvs_config *)pfVar12);
  pfStack_1d98 = (fdb_kvs_handle *)0x10ebee;
  fVar3 = fdb_set_log_callback(pfStack_1d88,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_1d68,"./compact_test1",&fStack_1cd8);
    ppfVar17 = &pfStack_1d70;
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1d68._0_8_,ppfVar17,(fdb_kvs_config *)auStack_1d48);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec3d;
    fVar3 = fdb_set_log_callback(pfStack_1d70,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_19e0,"key%d",0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_1ae0,"meta%d",0);
    pbVar33 = abStack_1be0;
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)pbVar33,"body%d",0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ec9e;
    sVar6 = strlen(acStack_19e0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10eca9;
    sVar7 = strlen(acStack_1ae0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ecb4;
    sVar8 = strlen((char *)pbVar33);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_1d68 + 8),acStack_19e0,sVar6,acStack_1ae0,sVar7,pbVar33,
                   sVar8);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_1d88,(fdb_doc *)auStack_1d68._8_8_);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_19e0,"key%d",1);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_1ae0,"meta%d",1);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)pbVar33,"body%d",1);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed2c;
    sVar6 = strlen(acStack_19e0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed37;
    sVar7 = strlen(acStack_1ae0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed42;
    sVar8 = strlen((char *)pbVar33);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_1d68 + 0x10),acStack_19e0,sVar6,acStack_1ae0,sVar7,pbVar33,
                   sVar8);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_1d88,(fdb_doc *)auStack_1d68._16_8_);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_1d80,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_1d68._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_1d68._16_8_,
                   *(btree_print_func **)(auStack_1d68._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_1d68._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_1d80->file = true;
    pfStack_1d98 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_1d88,(fdb_doc *)pfStack_1d80);
    pfStack_1d98 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_1d80);
    pfStack_1d98 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_1d78,'\x01');
    pfStack_1d98 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_1d78,"./compact_test2");
    pfStack_1d98 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_1d98 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_19e0,"key%d",2);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_1ae0,"meta%d",2);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)pbVar33,"body%d",2);
    pfVar26 = (fdb_kvs_handle *)(auStack_1d68 + 0x18);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_19e0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee3b;
    pfVar5 = (fdb_kvs_handle *)strlen(acStack_1ae0);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee46;
    sVar6 = strlen((char *)pbVar33);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)pfVar26,acStack_19e0,doc._M_i,acStack_1ae0,(size_t)pfVar5,pbVar33,
                   sVar6);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_1d88,(fdb_doc *)auStack_1d68._24_8_);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_1d78,'\x01');
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_1d88);
    ppfVar17 = &pfStack_1d70;
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_1d70);
    pfStack_1d98 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_1d78);
    pfVar12 = (fdb_kvs_handle *)auStack_1d68;
    pfStack_1d98 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_1d68._0_8_);
    pfStack_1d98 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_1d98 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",&fStack_1cd8);
    pfStack_1d98 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1d68._0_8_,ppfVar17,(fdb_kvs_config *)auStack_1d48);
    pfStack_1d98 = (fdb_kvs_handle *)0x10eef5;
    fVar3 = fdb_set_log_callback(pfStack_1d70,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar17 = &pfStack_1d80;
      while( true ) {
        pfStack_1d98 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar17,
                       (void *)(*(size_t **)(auStack_1d68 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_1d68 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_1d98 = (fdb_kvs_handle *)0x10ef38;
        fVar3 = fdb_get(pfStack_1d70,(fdb_doc *)pfStack_1d80);
        pfVar25 = pfStack_1d80;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_1d98 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar25);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar12 = pfVar25;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_1d98 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_1d68._0_8_,&fStack_1d20);
          pfStack_1d98 = (fdb_kvs_handle *)0x10efd4;
          iVar4 = strcmp("./compact_test2",fStack_1d20.filename);
          if (iVar4 != 0) {
            pfStack_1d98 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_1d98 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_1d70);
          pfStack_1d98 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_1d68._0_8_);
          lVar15 = 0;
          do {
            pfStack_1d98 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_1d68 + lVar15 * 8 + 8));
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          pfStack_1d98 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_1d98 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_1d98 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar21,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pbVar33 = pfStack_1d80->staletree;
        pfVar5 = *(fdb_kvs_handle **)(auStack_1d68 + doc._M_i * 8 + 8);
        pfVar26 = (fdb_kvs_handle *)pfVar5->staletree;
        pfStack_1d98 = (fdb_kvs_handle *)0x10ef77;
        iVar4 = bcmp(pbVar33,pfVar26,(size_t)(pfStack_1d80->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          pbVar33 = (pfVar25->field_6).seqtree;
          pfVar26 = (fdb_kvs_handle *)(pfVar5->field_6).seqtree;
          pfStack_1d98 = (fdb_kvs_handle *)0x10ef96;
          iVar4 = bcmp(pbVar33,pfVar26,(size_t)(pfVar25->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010ef9e;
          pfStack_1d98 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar12 = pfVar25;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar25 = pfVar12;
        pfStack_1d98 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_1d98 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar12 = pfVar25;
LAB_0010f073:
      pfStack_1d98 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_1d98 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_1d98 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_1d98 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_2300 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_1dc0 = ppfVar17;
  pfStack_1db8 = pfVar26;
  pfStack_1db0 = (fdb_kvs_handle *)doc._M_i;
  pfStack_1da8 = pfVar12;
  pbStack_1da0 = pbVar33;
  pfStack_1d98 = pfVar5;
  gettimeofday(&tStack_2270,(__timezone_ptr_t)0x0);
  pfStack_2300 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_2300 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2300 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_2260;
  pfStack_2300 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_1eb8.buffercache_size = 0x1000000;
  fStack_1eb8.wal_threshold = 0x400;
  fStack_1eb8.flags = 1;
  fStack_1eb8.compaction_threshold = '\0';
  ppfVar34 = &pfStack_22d8;
  pfStack_2300 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar34,"./compact_test1",&fStack_1eb8);
  ptr_handle = (list *)(auStack_22e8 + 8);
  pfStack_2300 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_22d8,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar12
            );
  pfStack_2300 = (fdb_kvs_handle *)0x10f133;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_22e8._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar26 = (fdb_kvs_handle *)0x0;
    uVar14 = 0;
    do {
      pfStack_2300 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_2048,"key%d",uVar14 & 0xffffffff);
      pfStack_2300 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_2260 + 0x118,"meta%d",uVar14 & 0xffffffff);
      pfStack_2300 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_2260 + 0x18,"body%d",uVar14 & 0xffffffff);
      ppfVar34 = (fdb_doc **)((long)apfStack_22c8 + (long)pfVar26);
      pfStack_2300 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_2048);
      pfVar5 = (fdb_kvs_handle *)(auStack_2260 + 0x118);
      pfStack_2300 = (fdb_kvs_handle *)0x10f1ae;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)pfVar5);
      pfStack_2300 = (fdb_kvs_handle *)0x10f1be;
      sVar6 = strlen(auStack_2260 + 0x18);
      pfStack_2300 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar34,acStack_2048,doc._M_i,pfVar5,(size_t)pfVar12,auStack_2260 + 0x18,sVar6
                    );
      pfStack_2300 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_22e8._8_8_,apfStack_22c8[uVar14]);
      uVar14 = uVar14 + 1;
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 8);
    } while (uVar14 != 10);
    pfStack_2300 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_22d8,'\x01');
    pfStack_2300 = (fdb_kvs_handle *)0x10f226;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_22e8._8_8_,&pfStack_22d0,10);
    ptr_handle = (list *)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_2300 = (fdb_kvs_handle *)0x10f23f;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_22d8,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar12 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_2300 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_22e8,apfStack_22c8[(long)pfVar12]->key,
                       apfStack_22c8[(long)pfVar12]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2300 = (fdb_kvs_handle *)0x10f282;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_22e8._8_8_,(fdb_doc *)auStack_22e8._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_2300 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_2300 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_22e8._0_8_);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
      } while (pfVar12 != (fdb_kvs_handle *)0xa);
      pfStack_2300 = (fdb_kvs_handle *)0x10f2b1;
      iVar4 = stat("./compact_test1",&sStack_1f48);
      if (iVar4 == 0) {
        pfStack_2300 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar12 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_2300 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_22e8,apfStack_22c8[(long)pfVar12]->key,
                       apfStack_22c8[(long)pfVar12]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2300 = (fdb_kvs_handle *)0x10f2f5;
        fVar3 = fdb_get(pfStack_22d0,(fdb_doc *)auStack_22e8._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_2300 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_22e8._0_8_);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
        if (pfVar12 == (fdb_kvs_handle *)0xa) {
          pfStack_2300 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_22d8);
          pfStack_2300 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar15 = 0;
          do {
            pfStack_2300 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_22c8[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 10);
          pfStack_2300 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_2300 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar21,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_22e8;
      pfStack_2300 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_2300 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_2300 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_2300 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f3b5;
  fStack_2510.bub_ctx.entries = ptr_handle;
  fStack_2510.bub_ctx.num_entries = (uint64_t)pfVar26;
  fStack_2510.bub_ctx.space_used = doc._M_i;
  fStack_2510.bub_ctx.handle = pfVar12;
  ppfStack_2308 = ppfVar34;
  pfStack_2300 = pfVar5;
  gettimeofday(&tStack_2a10,(__timezone_ptr_t)0x0);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_2a58;
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_2900._256_8_ = 0x1000000;
  auStack_2900._264_8_ = 0x400;
  auStack_2900._284_4_ = 1;
  auStack_2900[0x127] = 0;
  pfVar12 = (fdb_kvs_handle *)(auStack_2a80 + 0x18);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",(fdb_config *)(auStack_2900 + 0xf8));
  ppfVar17 = (fdb_kvs_handle **)(auStack_2a80 + 8);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_2a80._24_8_,ppfVar17,(char *)0x0,kvs_config_00);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f440;
  pfVar25 = (fdb_kvs_handle *)auStack_2a80._8_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_2a80._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar26 = (fdb_kvs_handle *)0x0;
    uVar14 = 0;
    do {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_2610,"key%d",uVar14 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_2900 + 0x1f0,"meta%d",uVar14 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_2a00,"body%d",uVar14 & 0xffffffff);
      pfVar12 = (fdb_kvs_handle *)(auStack_2900 + (long)pfVar26);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_2610);
      pfVar5 = (fdb_kvs_handle *)(auStack_2900 + 0x1f0);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar5);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f4ce;
      sVar6 = strlen(acStack_2a00);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar12,acStack_2610,doc._M_i,pfVar5,(size_t)kvs_config_00,
                     acStack_2a00,sVar6);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_2a80._8_8_,*(fdb_doc **)(auStack_2900 + uVar14 * 8));
      uVar14 = uVar14 + 1;
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 8);
    } while (uVar14 != 0x1e);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_2a80._24_8_,'\0');
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_2a80 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_2900 + 0xf8));
    ppfVar17 = (fdb_kvs_handle **)auStack_2a90;
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_2a80._16_8_,ppfVar17,(char *)0x0,&fStack_2a58);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f56b;
    pfVar25 = (fdb_kvs_handle *)auStack_2a90._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2a90._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    pfVar26 = (fdb_kvs_handle *)0x0;
    uVar14 = 0;
    do {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_2610,"k2ey%d",uVar14 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_2900 + 0x1f0,"m2eta%d",uVar14 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_2a00,"b2ody%d",uVar14 & 0xffffffff);
      pfVar12 = (fdb_kvs_handle *)(&fStack_2510.kvs_config.create_if_missing + (long)pfVar26);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_2610);
      pfVar5 = (fdb_kvs_handle *)(auStack_2900 + 0x1f0);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar5);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f5f9;
      sVar6 = strlen(acStack_2a00);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar12,acStack_2610,doc._M_i,pfVar5,(size_t)kvs_config_00,
                     acStack_2a00,sVar6);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_2a90._0_8_,
              *(fdb_doc **)(&fStack_2510.kvs_config.create_if_missing + uVar14 * 8));
      uVar14 = uVar14 + 1;
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 8);
    } while (uVar14 != 0x3c);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_2a80._16_8_,'\0');
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2a90._0_8_,&fStack_2a40);
    if ((filemgr *)fStack_2a40.last_seqnum != (filemgr *)0x3c) {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2a90._0_8_);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_2a80._16_8_);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f68c;
    pfVar25 = (fdb_kvs_handle *)auStack_2a80._24_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_2a80._24_8_,(char *)0x0);
    ppfVar17 = (fdb_kvs_handle **)0x3c;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_2a80 + 8);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2a80._8_8_);
    pfVar12 = (fdb_kvs_handle *)(auStack_2a80 + 0x18);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_2a80._24_8_);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",(fdb_config *)(auStack_2900 + 0xf8));
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_2a80._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_2a58);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f6ed;
    pfVar25 = (fdb_kvs_handle *)auStack_2a80._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2a80._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar17 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_2a90 + 8);
    pfVar12 = (fdb_kvs_handle *)auStack_2a80;
    do {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_2900 + (long)ppfVar17))[4],
                     **(size_t **)(auStack_2900 + (long)ppfVar17),(void *)0x0,0,(void *)0x0,0);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f737;
      pfVar25 = (fdb_kvs_handle *)auStack_2a80._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_2a80._8_8_,(fdb_doc *)auStack_2a90._8_8_);
      pfVar20 = (fdb_kvs_handle *)auStack_2a90._8_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_2900 + (long)ppfVar17);
      pfVar26 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f765;
      iVar4 = bcmp(*(btree **)(auStack_2a90._8_8_ + 0x38),pfVar26->staletree,
                   (size_t)((fdb_kvs_config *)auStack_2a90._8_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar20 = pfStack_2a60;
        pfVar26 = (fdb_kvs_handle *)auStack_2a80._0_8_;
      }
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f77b;
      iVar4 = bcmp((pfVar20->field_6).seqtree,(pfVar26->field_6).seqtree,
                   (size_t)(pfVar20->kvs_config).custom_cmp_param);
      pfVar5 = pfVar20;
      if (iVar4 != 0) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar5 = (fdb_kvs_handle *)auStack_2a80._0_8_;
      }
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar5);
      ppfVar17 = ppfVar17 + 1;
    } while (ppfVar17 != (fdb_kvs_handle **)0xf0);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_2a80 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_2900 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_2a90;
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_2a80._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_2a58);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f817;
    pfVar25 = (fdb_kvs_handle *)auStack_2a90._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2a90._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_2a90._0_8_,&fStack_2a40);
      if ((filemgr *)fStack_2a40.last_seqnum != (filemgr *)0x3c) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar5 = (fdb_kvs_handle *)0x0;
      ppfVar17 = (fdb_kvs_handle **)(auStack_2a90 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_2a80;
      while( true ) {
        psVar2 = *(size_t **)
                  (&fStack_2510.kvs_config.create_if_missing +
                  (long)&(pfVar5->kvs_config).create_if_missing);
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar17,(void *)psVar2[4],*psVar2,(void *)0x0,0,(void *)0x0,0);
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f884;
        pfVar25 = (fdb_kvs_handle *)auStack_2a90._0_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_2a90._0_8_,(fdb_doc *)auStack_2a90._8_8_);
        pfVar20 = (fdb_kvs_handle *)auStack_2a90._8_8_;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfVar26 = (fdb_kvs_handle *)
                  (&fStack_2510.kvs_config.create_if_missing +
                  (long)&(pfVar5->kvs_config).create_if_missing);
        pfVar12 = *(fdb_kvs_handle **)&pfVar26->kvs_config;
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f8b1;
        iVar4 = bcmp(*(btree **)(auStack_2a90._8_8_ + 0x38),pfVar12->staletree,
                     (size_t)((fdb_kvs_config *)auStack_2a90._8_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar20 = pfStack_2a60;
          pfVar12 = (fdb_kvs_handle *)auStack_2a80._0_8_;
        }
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f8c6;
        iVar4 = bcmp((pfVar20->field_6).seqtree,(pfVar12->field_6).seqtree,
                     (size_t)(pfVar20->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar20;
        if (iVar4 != 0) {
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_2a80._0_8_;
        }
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).custom_cmp;
        if (pfVar5 == (fdb_kvs_handle *)0x1e0) {
          lVar15 = 0;
          do {
            pfStack_2aa8 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_2900 + lVar15 * 8));
            pfStack_2aa8 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_2510.kvs_config.create_if_missing + lVar15 * 8));
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x1e);
          lVar15 = 0;
          do {
            pfStack_2aa8 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_2510.config.encryption_key.bytes + lVar15 * 8 + -0x14)
                        );
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x1e);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2a80._8_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_2a80._24_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2a90._0_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_2a80._16_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar21,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_2aa8 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_2ad0 = ppfVar17;
  pfStack_2ac8 = pfVar26;
  pfStack_2ac0 = (fdb_kvs_handle *)doc._M_i;
  pfStack_2ab8 = kvs_config_00;
  pfStack_2ab0 = pfVar12;
  pfStack_2aa8 = pfVar5;
  gettimeofday(&tStack_3200,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_31f0.buffercache_size = 0;
  fStack_31f0.wal_threshold = 0x400;
  fStack_31f0.compaction_threshold = '\0';
  if (pfVar25 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var27._M_i = (__int_type_conflict)&pfStack_3268;
    fVar3 = fdb_open((fdb_file_handle **)_Var27._M_i,"./compact_test1",&fStack_31f0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      _Var27._M_i = (__int_type_conflict)pfStack_3268;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3268,&pfStack_3260,&fStack_3248);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar15 = 0;
      uVar14 = 0;
      do {
        __s = &afStack_2ff8[0].config.encryption_key;
        sprintf((char *)__s,"key%d",uVar14 & 0xffffffff);
        sprintf((char *)afStack_2ff8,"meta%d",uVar14 & 0xffffffff);
        sprintf(acStack_30f8,"body%d",uVar14 & 0xffffffff);
        doc._M_i = strlen((char *)__s);
        pfVar5 = afStack_2ff8;
        sVar6 = strlen((char *)pfVar5);
        sVar7 = strlen(acStack_30f8);
        fdb_doc_create((fdb_doc **)((long)&afStack_2ff8[0].bub_ctx.handle + lVar15),
                       &afStack_2ff8[0].config.encryption_key,doc._M_i,pfVar5,sVar6,acStack_30f8,
                       sVar7);
        fdb_set(pfStack_3260,(fdb_doc *)(&afStack_2ff8[0].bub_ctx.handle)[uVar14]);
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 8;
      } while (uVar14 != 100);
      fdb_commit((fdb_file_handle *)pfStack_3268,'\0');
      fdb_get_kvs_info(pfStack_3260,&fStack_3230);
      if ((filemgr *)fStack_3230.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar15 = 0;
      pfVar12 = (fdb_kvs_handle *)&plStack_3258;
      do {
        fdb_del(pfStack_3260,(fdb_doc *)(&afStack_2ff8[0].bub_ctx.handle)[lVar15]);
        if (lVar15 == 0x32) {
          pthread_create((pthread_t *)pfVar12,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_3268);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 100);
      pthread_join((pthread_t)plStack_3258,&pvStack_3250);
      fdb_commit((fdb_file_handle *)pfStack_3268,'\x01');
      fdb_get_kvs_info(pfStack_3260,&fStack_3230);
      if ((filemgr *)fStack_3230.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_3260);
      _Var27._M_i = (__int_type_conflict)&pfStack_3268;
      fdb_close((fdb_file_handle *)pfStack_3268);
      fVar3 = fdb_open((fdb_file_handle **)_Var27._M_i,"./compact_test1",&fStack_31f0);
      pfVar26 = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var27._M_i = (__int_type_conflict)pfStack_3268;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3268,&pfStack_3260,&fStack_3248);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_3260,&fStack_3230);
        if ((filemgr *)fStack_3230.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar15 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_2ff8[0].bub_ctx.handle)[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 100);
        fdb_kvs_close(pfStack_3260);
        fdb_close((fdb_file_handle *)pfStack_3268);
        fdb_shutdown();
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar21,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var27._M_i = (__int_type_conflict)&pfStack_3268;
    fVar3 = fdb_open((fdb_file_handle **)_Var27._M_i,"./compact_test1",&fStack_31f0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var27._M_i = (__int_type_conflict)pfStack_3268;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_3268,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_3268);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_17028 = (fdb_kvs_handle *)0x10fd83;
  auStack_16ff0._8_8_ = _Var27._M_i;
  gettimeofday(&tStack_16e88,(__timezone_ptr_t)0x0);
  pfStack_17028 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_17028 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar21 = auStack_16f90;
  pfStack_17028 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_17028 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_16f90._8_8_ = 0;
  aStack_16f80.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_16f6c = 1;
  uStack_16f62 = 0x1e01;
  pfStack_16f58 = (filemgr *)0x1;
  aStack_16f18.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar31 = auStack_17018;
  pfStack_17028 = (fdb_kvs_handle *)0x10fde7;
  fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test",(fdb_config *)pcVar21);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    aStack_16f18.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_17028 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_17018,"compact_test",(fdb_config *)auStack_16f90);
    pcVar21 = auStack_17010;
    pfStack_17028 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_17018,(fdb_kvs_handle **)pcVar21,&fStack_16fe0);
    pfStack_17028 = (fdb_kvs_handle *)0x10fe3f;
    pcVar31 = (char *)auStack_17010;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17010,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_17028 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar14 = 0;
    do {
      pfStack_17028 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_16e78 + 0x48,"key%04d",uVar14 & 0xffffffff);
      pfStack_17028 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_16c30,"meta%04d",uVar14 & 0xffffffff);
      pfStack_17028 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_16d30,"body%04d",uVar14 & 0xffffffff);
      pfVar26 = (fdb_kvs_handle *)(&afStack_16b30[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_17028 = (fdb_kvs_handle *)0x10feba;
      sVar6 = strlen(auStack_16e78 + 0x48);
      pfVar5 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_17028 = (fdb_kvs_handle *)0x10fece;
      sVar6 = strlen(acStack_16c30);
      pfVar12 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_17028 = (fdb_kvs_handle *)0x10fedf;
      sVar6 = strlen(acStack_16d30);
      pfStack_17028 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)pfVar26,auStack_16e78 + 0x48,(size_t)pfVar5,acStack_16c30,
                     (size_t)pfVar12,acStack_16d30,sVar6 + 1);
      pfStack_17028 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_17010,
              *(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + uVar14 * 8));
      uVar14 = uVar14 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar14 != 10000);
    pcVar21 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_17018,'\0');
    pfStack_17028 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_17018);
    pfStack_17028 = (fdb_kvs_handle *)0x10ff5b;
    pcVar31 = pcVar21;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test",(fdb_config *)auStack_16f90);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_17028 = (fdb_kvs_handle *)0x10ff77;
    pcVar31 = (char *)auStack_17018;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17018,(fdb_kvs_handle **)auStack_17010,
                       &fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_17028 = (fdb_kvs_handle *)0x10ff97;
    pcVar31 = (char *)auStack_17010;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17010,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar21 = auStack_16e78;
    pfStack_17028 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_17018,(fdb_file_info *)pcVar21);
    pfStack_17028 = (fdb_kvs_handle *)0x10ffc3;
    iVar4 = strcmp((char *)auStack_16e78._0_8_,"compact_test");
    if (iVar4 != 0) {
      pfStack_17028 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_16e78 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_17000;
    pfVar26 = (fdb_kvs_handle *)0x0;
    _Var27._M_i = doc._M_i;
    do {
      pfStack_17028 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar26 & 0xffffffff);
      pfStack_17028 = (fdb_kvs_handle *)0x110000;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_17028 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_17028 = (fdb_kvs_handle *)0x11002e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_17010,(fdb_doc *)auStack_17000._0_8_);
      doc._M_i = auStack_17000._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_17028 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar5 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_17000._0_8_ + 0x40))->
               seqtree;
      pcVar21 = *(char **)(*(long *)(&afStack_16b30[0].kvs_config.create_if_missing +
                                    (long)pfVar26 * 8) + 0x40);
      pfStack_17028 = (fdb_kvs_handle *)0x11005a;
      iVar4 = bcmp(pfVar5,pcVar21,(size_t)*(void **)(auStack_17000._0_8_ + 0x10));
      _Var27._M_i = doc._M_i;
      if (iVar4 != 0) {
        pfStack_17028 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_17028 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
    } while (pfVar26 != (fdb_kvs_handle *)0x2710);
    pfStack_17028 = (fdb_kvs_handle *)0x11008e;
    pcVar31 = (char *)auStack_17010;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_17010,(fdb_kvs_handle **)&aStack_16fc8,10000
                             );
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_17028 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_16fc8.super___atomic_base<unsigned_long>._M_i);
    pcVar21 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_17018);
    pfStack_17028 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_17028 = (fdb_kvs_handle *)0x1100d0;
    pcVar31 = pcVar21;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_17028 = (fdb_kvs_handle *)0x1100ec;
    pcVar31 = (char *)auStack_17018;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17018,(fdb_kvs_handle **)auStack_17010,
                       &fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_17028 = (fdb_kvs_handle *)0x11010c;
    pcVar31 = (char *)auStack_17010;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17010,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_16e78 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_17000;
    pfVar26 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_17028 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar26 & 0xffffffff);
      pfStack_17028 = (fdb_kvs_handle *)0x110140;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_17028 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_17028 = (fdb_kvs_handle *)0x11016e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_17010,(fdb_doc *)auStack_17000._0_8_);
      _Var27._M_i = auStack_17000._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar5 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_17000._0_8_ + 0x40))->
               seqtree;
      pcVar21 = *(char **)(*(long *)(&afStack_16b30[0].kvs_config.create_if_missing +
                                    (long)pfVar26 * 8) + 0x40);
      pfStack_17028 = (fdb_kvs_handle *)0x11019a;
      iVar4 = bcmp(pfVar5,pcVar21,(size_t)*(void **)(auStack_17000._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108a3;
      pfStack_17028 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var27._M_i);
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
      doc._M_i = _Var27._M_i;
    } while (pfVar26 != (fdb_kvs_handle *)0x2710);
    pcVar21 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_17018);
    pfStack_17028 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_17028 = (fdb_kvs_handle *)0x1101ea;
    pcVar31 = pcVar21;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_17028 = (fdb_kvs_handle *)0x110206;
    pcVar31 = (char *)auStack_17018;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17018,(fdb_kvs_handle **)auStack_17010,
                       &fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_17028 = (fdb_kvs_handle *)0x110226;
    pcVar31 = (char *)auStack_17010;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17010,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_16e78 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_17000;
    pfVar26 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_17028 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar26 & 0xffffffff);
      pfStack_17028 = (fdb_kvs_handle *)0x11025a;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_17028 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_17028 = (fdb_kvs_handle *)0x110288;
      pcVar31 = (char *)auStack_17010;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_17010,(fdb_doc *)auStack_17000._0_8_);
      _Var27._M_i = auStack_17000._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar5 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_17000._0_8_ + 0x40))->
               seqtree;
      pcVar21 = *(char **)(*(long *)(&afStack_16b30[0].kvs_config.create_if_missing +
                                    (long)pfVar26 * 8) + 0x40);
      pfStack_17028 = (fdb_kvs_handle *)0x1102b4;
      iVar4 = bcmp(pfVar5,pcVar21,(size_t)*(void **)(auStack_17000._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108b3;
      pfStack_17028 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var27._M_i);
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
      doc._M_i = _Var27._M_i;
    } while (pfVar26 != (fdb_kvs_handle *)0x2710);
    pfStack_17028 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_17018);
    pcVar31 = auStack_16ff0;
    pfStack_17028 = (fdb_kvs_handle *)0x1102f7;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_less",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_17028 = (fdb_kvs_handle *)0x110313;
    pcVar31 = (char *)auStack_16ff0._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16ff0._0_8_,
                       (fdb_kvs_handle **)&aStack_16fb0.seqtree,&fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_16f62 = uStack_16f62 & 0xff;
    pcVar31 = auStack_17000 + 8;
    pfStack_17028 = (fdb_kvs_handle *)0x110338;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_17028 = (fdb_kvs_handle *)0x110354;
    pcVar31 = (char *)auStack_17000._8_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17000._8_8_,(fdb_kvs_handle **)&_Stack_16fb8,
                       &fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_16f62 = uStack_16f62 & 0xff00;
    pcVar31 = auStack_17008;
    pfStack_17028 = (fdb_kvs_handle *)0x110379;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_17028 = (fdb_kvs_handle *)0x110395;
    pcVar31 = (char *)auStack_17008;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17008,(fdb_kvs_handle **)&aStack_16fc0.seqtree,
                       &fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_16f62 = 0x1e01;
    pcVar31 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x1103bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_17028 = (fdb_kvs_handle *)0x1103d8;
    pcVar31 = (char *)auStack_17018;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17018,(fdb_kvs_handle **)auStack_17010,
                       &fStack_16fe0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_17028 = (fdb_kvs_handle *)0x1103f8;
    pcVar31 = (char *)auStack_17010;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17010,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var27._M_i = 0;
    pfStack_17028 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar21 = auStack_16e98;
    pfStack_17028 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar21,(__timezone_ptr_t)0x0);
    tVar36.tv_usec = auStack_16e98._8_8_;
    tVar36.tv_sec = auStack_16e98._0_8_;
    pfVar26 = (fdb_kvs_handle *)auStack_16fa0;
    while( true ) {
      pfStack_17028 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_17010,
              *(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + _Var27._M_i * 8));
      pfStack_17028 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_17018,'\0');
      if ((ushort)((ushort)((short)_Var27._M_i * 0x5c29) >> 2 | (short)_Var27._M_i * 0x4000) < 0x290
         ) {
        pfStack_17028 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_16fb0.seqtree,
                *(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + _Var27._M_i * 8));
        pfStack_17028 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_16ff0._0_8_,'\0');
      }
      pfStack_17028 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_16fb8._M_i,
              *(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + _Var27._M_i * 8));
      pfStack_17028 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_17000._8_8_,'\0');
      pfStack_17028 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_16fc0.seqtree,
              *(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + _Var27._M_i * 8));
      pfStack_17028 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_17008,'\0');
      pfStack_17028 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)pfVar26,(__timezone_ptr_t)0x0);
      pfStack_17028 = (fdb_kvs_handle *)0x1104e9;
      tVar35 = _utime_gap(tVar36,(timeval)auStack_16fa0);
      if ((ulong)auStack_16ff0._8_8_ <= (fdb_kvs_handle *)tVar35.tv_sec) break;
      _Var27._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var27._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var27._M_i == (undefined1 *)0x2710) {
        _Var27._M_i = 0;
      }
    }
    pfStack_17028 = (fdb_kvs_handle *)0x110517;
    pcVar31 = (char *)auStack_17018;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_17018,0x3c);
    ptr_fhandle = (filemgr *)auStack_16e98._0_8_;
    pfVar12 = (fdb_kvs_handle *)auStack_16e98._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_17028 = (fdb_kvs_handle *)0x11052e;
    pcVar31 = (char *)auStack_17018;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_17018,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_17028 = (fdb_kvs_handle *)0x110542;
    pcVar31 = (char *)auStack_17000._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_17000._8_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_17028 = (fdb_kvs_handle *)0x11055b;
    pcVar31 = (char *)auStack_17008;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_17008,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_16f62 = uStack_16f62 & 0xff00;
    pcVar31 = auStack_16fa8;
    pfStack_17028 = (fdb_kvs_handle *)0x110580;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_17028 = (fdb_kvs_handle *)0x11059c;
    pcVar31 = (char *)auStack_17008;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_17008,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_17028 = (fdb_kvs_handle *)0x1105af;
    fVar3 = fdb_close((fdb_file_handle *)auStack_16fa8);
    pcVar31 = (char *)auStack_16fa8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_17028 = (fdb_kvs_handle *)0x1105cb;
    pcVar31 = (char *)auStack_17008;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_17008,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_17028 = (fdb_kvs_handle *)0x1105e7;
    pcVar31 = (char *)auStack_17008;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_17008,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_17028 = (fdb_kvs_handle *)0x1105f9;
    pcVar31 = (char *)auStack_17008;
    fVar3 = fdb_close((fdb_file_handle *)auStack_17008);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_16f62 = CONCAT11(uStack_16f62._1_1_,1);
    pcVar31 = auStack_17008;
    pfStack_17028 = (fdb_kvs_handle *)0x11061e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_17028 = (fdb_kvs_handle *)0x110634;
    pcVar31 = (char *)auStack_17000._8_8_;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_17000._8_8_,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_17028 = (fdb_kvs_handle *)0x110646;
    pcVar31 = (char *)auStack_17000._8_8_;
    fVar3 = fdb_close((fdb_file_handle *)auStack_17000._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_16f62 = uStack_16f62 & 0xff00;
    pcVar31 = auStack_17000 + 8;
    pfStack_17028 = (fdb_kvs_handle *)0x11066b;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar21 = "compact_test_non.manual";
    pfStack_17028 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_17000._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_17018);
    pfStack_17028 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_16ff0._0_8_);
    pfStack_17028 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_17008);
    uStack_16f62 = CONCAT11(uStack_16f62._1_1_,1);
    pfStack_17028 = (fdb_kvs_handle *)0x1106bf;
    pcVar31 = (char *)ptr_fhandle;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar31 = "compact_test_non.manual";
    pfStack_17028 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_16f62 = uStack_16f62 & 0xff00;
    pcVar31 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x110702;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar31 = "compact_test_manual_compacted";
    pfStack_17028 = (fdb_kvs_handle *)0x11071f;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_16f62 = CONCAT11(uStack_16f62._1_1_,1);
    pcVar31 = "compact_test_manual_compacted";
    pfStack_17028 = (fdb_kvs_handle *)0x110740;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_16f62 = uStack_16f62 & 0xff00;
    pcVar31 = "compact_test_non.manual";
    pfStack_17028 = (fdb_kvs_handle *)0x110760;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_17028 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_17000._8_8_);
    pfStack_17028 = (fdb_kvs_handle *)0x110778;
    fVar3 = fdb_shutdown();
    pcVar31 = (char *)auStack_17000._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar31 = "compact_test_non.manual";
    pfStack_17028 = (fdb_kvs_handle *)0x110794;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_16f6c = 2;
    pcVar31 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x1107bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar31 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x1107de;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar31 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x110800;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar31 = auStack_17018;
    pfStack_17028 = (fdb_kvs_handle *)0x110822;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non.manual",
                     (fdb_config *)auStack_16f90);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar15 = 0;
      do {
        pfStack_17028 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + lVar15 * 8));
        lVar15 = lVar15 + 1;
      } while (lVar15 != 10000);
      pfStack_17028 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_17028 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_17028 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar21,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_17028 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_17028 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_17028 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_17028 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_17028 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_17028 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_17028 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_17028 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var27._M_i = doc._M_i;
LAB_001108eb:
    pfStack_17028 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_17028 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_17028 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_17028 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_17028 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_17028 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_17028 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_17028 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_17028 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_17028 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_17028 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_17028 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_17028 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_17028 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_17028 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_17028 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_17028 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_17028 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_17028 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_17028 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_17028 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_17028 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_17028 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_17028 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_17028 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_17028 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_17028 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_17028 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_17028 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_17028 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_17028 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_17028 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_17028 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_17028 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_17028 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_17028 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_17028 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_17028 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_17028 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_171c0 = (fdb_kvs_handle *)0x1109ce;
  pfStack_17050 = (filemgr *)pcVar21;
  pfStack_17048 = pfVar26;
  pfStack_17040 = (fdb_kvs_handle *)_Var27._M_i;
  pfStack_17038 = ptr_fhandle;
  pfStack_17030 = pfVar12;
  pfStack_17028 = pfVar5;
  gettimeofday(&tStack_17170,(__timezone_ptr_t)0x0);
  pfStack_171c0 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_171c0 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_171c0 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_1711a = 1;
  uStack_17110._0_2_ = 1;
  uStack_17110._2_2_ = 0;
  uStack_17110._4_4_ = 0;
  pfStack_171c0 = (fdb_kvs_handle *)0x110a0d;
  fVar3 = fdb_open(&pfStack_171b0,"compact_test",(fdb_config *)(auStack_17160 + 0x18));
  pfVar28 = (fdb_config *)(auStack_17160 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar28 = (fdb_config *)auStack_17160;
    pfStack_171c0 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_171c0 = (fdb_kvs_handle *)0x110a34;
    fVar3 = fdb_kvs_open_default(pfStack_171b0,&pfStack_171a8,(fdb_kvs_config *)pfVar28);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_171c0 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_17180,(__timezone_ptr_t)0x0);
    pfStack_171c0 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar31 & 0xffffffff);
    tVar35.tv_usec = tStack_17180.tv_usec;
    tVar35.tv_sec = tStack_17180.tv_sec;
    _Var27._M_i = (long)&atStack_171a0[1].tv_sec + 1;
    pfVar5 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar5;
      pfStack_171c0 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var27._M_i,"%d",pfVar5);
      pfVar26 = pfStack_171a8;
      pfStack_171c0 = (fdb_kvs_handle *)0x110a89;
      sVar6 = strlen((char *)_Var27._M_i);
      pfStack_171c0 = (fdb_kvs_handle *)0x110aa4;
      fVar3 = fdb_set_kv(pfVar26,(void *)_Var27._M_i,sVar6,"value",5);
      pfVar28 = (fdb_config *)tStack_17180.tv_sec;
      pfVar12 = (fdb_kvs_handle *)tStack_17180.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_171c0 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_171c0 = (fdb_kvs_handle *)0x110ab8;
      fVar3 = fdb_commit(pfStack_171b0,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_171c0 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_171c0 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_171a0,(__timezone_ptr_t)0x0);
      pfStack_171c0 = (fdb_kvs_handle *)0x110ae1;
      tVar36 = _utime_gap(tVar35,atStack_171a0[0]);
    } while (((filemgr *)tVar36.tv_sec < pcVar31) &&
            (pfVar5 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_171c0 = (fdb_kvs_handle *)0x110b01;
    fVar3 = fdb_close(pfStack_171b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_171c0 = (fdb_kvs_handle *)0x110b0a;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_171c0 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_171c0 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar21,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_171c0 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_171c0 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_171c0 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_171c0 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_171e8 = (filemgr *)pcVar31;
  pfStack_171e0 = pfVar26;
  pfStack_171d8 = (fdb_kvs_handle *)_Var27._M_i;
  pfStack_171d0 = pfVar28;
  pfStack_171c8 = pfVar12;
  pfStack_171c0 = pfVar5;
  gettimeofday(&tStack_174f0,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_17560._32_8_ = (btree *)0x0;
  auStack_17560._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_172e0.wal_threshold = 0x1000;
  fStack_172e0.compaction_mode = '\x01';
  fStack_172e0.compaction_threshold = '\n';
  fStack_172e0.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar5 = (fdb_kvs_handle *)&pfStack_17580;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar5,"compact_test",&fStack_172e0,1,
                              (char **)(auStack_17560 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_17560 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_17560._16_8_ = afStack_174e0[0].doc_count;
    auStack_17560._0_8_ = afStack_174e0[0].filename;
    auStack_17560._8_8_ = afStack_174e0[0].new_filename;
    info = (fdb_file_info *)auStack_17578;
    pfVar5 = pfStack_17580;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17580,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_17560);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_17568;
    kvs_config_01 = (fdb_file_info *)auStack_17560;
    pfVar5 = pfStack_17580;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17580,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar14 = 0;
    do {
      sprintf((char *)afStack_174e0,"key%06d",uVar14);
      sprintf((char *)afStack_173e0,"body%06d",uVar14);
      pfVar5 = (fdb_kvs_handle *)auStack_17578._0_8_;
      sVar6 = strlen((char *)afStack_174e0);
      sVar7 = strlen((char *)afStack_173e0);
      kvs_config_01 = afStack_173e0;
      info = afStack_174e0;
      fVar3 = fdb_set_kv(pfVar5,afStack_174e0,sVar6,afStack_173e0,sVar7);
      handle = auStack_17568;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar6 = strlen((char *)afStack_174e0);
      sVar7 = strlen((char *)afStack_173e0);
      kvs_config_01 = afStack_173e0;
      info = afStack_174e0;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_174e0,sVar6,afStack_173e0,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar5 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar19 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar19;
    } while (uVar19 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_17560;
    auStack_17560._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_17578 + 8);
    pfVar5 = pfStack_17580;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17580,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_174e0;
    sprintf((char *)info,"key%06d",0);
    kvs_config_01 = afStack_173e0;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar6 = strlen((char *)info);
    sVar7 = strlen((char *)kvs_config_01);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_17578._8_8_,info,sVar6,kvs_config_01,sVar7);
    pfVar5 = (fdb_kvs_handle *)auStack_17578._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar5 = pfStack_17580;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17580,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar14 = 0;
    uVar29 = 0;
    do {
      sprintf((char *)afStack_174e0,"key%06d",uVar29);
      sprintf((char *)afStack_173e0,"body%06d",uVar29);
      pfVar5 = (fdb_kvs_handle *)auStack_17578._0_8_;
      sVar6 = strlen((char *)afStack_174e0);
      sVar7 = strlen((char *)afStack_173e0);
      kvs_config_01 = afStack_173e0;
      info = afStack_174e0;
      fVar3 = fdb_set_kv(pfVar5,afStack_174e0,sVar6,afStack_173e0,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_17560 + 0x28);
      pfVar5 = pfStack_17580;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17580,info);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar14 < uStack_17510) {
        uVar14 = uStack_17510;
      }
      uVar19 = (int)uVar29 + 1;
      uVar29 = (ulong)uVar19;
    } while (uVar19 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar5 = pfStack_17580;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17580,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_17560 + 0x28);
    pfVar5 = pfStack_17580;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17580,info);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar14 < uStack_17510) {
      uVar14 = uStack_17510;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar14);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_17560 + 0x28);
      pfVar5 = pfStack_17580;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17580,
                                (fdb_file_info *)(auStack_17560 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar14 <= uStack_17510);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17580);
    pfVar5 = pfStack_17580;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar5 = pfStack_17580;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar21,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info == kvs_config_01) {
    memcmp(pfVar5,__s2,(size_t)info);
    return;
  }
  if (info < kvs_config_01) {
    kvs_config_01 = info;
  }
  memcmp(pfVar5,__s2,(size_t)kvs_config_01);
  return;
}

Assistant:

void compact_reopen_with_iterator()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 9;
    int count = 0;
    int nkvdocs;
    fdb_file_handle *dbfile, *compact_file;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_kvs_info kvs_info;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_with_iterator");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // MB-13859: compact the file using a separate handle..
    fdb_open(&compact_file, "./compact_test1", &fconfig);
    // compact
    status = fdb_compact(compact_file, "./compact_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close file after compaction to make the new_file's ref count 0
    fdb_close(compact_file);

    i = 0;
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n);


    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test2", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen with iterator");
}